

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O0

void intgemm::kernel_write_test<(intgemm::CPUType)1,float>(void)

{
  StringRef capturedExpression;
  float *pfVar1;
  float *pfVar2;
  ExprLhs<const_float_&> *this;
  size_t __n;
  AssertionHandler catchAssertionHandler;
  size_t i;
  AlignedVector<float> output;
  AlignedVector<float> input;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  ExprLhs<const_float_&> in_stack_fffffffffffffeb0;
  StringRef *in_stack_fffffffffffffeb8;
  AlignedVector<float> *in_stack_fffffffffffffec0;
  AssertionHandler *this_00;
  size_type sVar3;
  AssertionHandler local_a0;
  ulong local_38;
  AlignedVector<float> local_20;
  AlignedVector<float> local_10;
  
  if (0 < kCPU) {
    AlignedVector<float>::AlignedVector
              (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
               (size_t)in_stack_fffffffffffffeb0.m_lhs);
    AlignedVector<float>::AlignedVector
              (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
               (size_t)in_stack_fffffffffffffeb0.m_lhs);
    pfVar1 = AlignedVector<float>::begin(&local_10);
    pfVar2 = AlignedVector<float>::end(&local_10);
    std::iota<float*,float>(pfVar1,pfVar2,0.0);
    this = (ExprLhs<const_float_&> *)AlignedVector<float>::as<float__vector(4)>(&local_10);
    pfVar1 = this->m_lhs;
    sVar3 = *(size_type *)(this + 1);
    pfVar2 = AlignedVector<float>::begin(&local_20);
    kernels::write((int)pfVar2,(void *)0x0,__n);
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      local_a0.m_assertionInfo.lineInfo =
           (SourceLineInfo)
           operator____catch_sr
                     ((char *)in_stack_fffffffffffffeb0.m_lhs,
                      CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      this_00 = &local_a0;
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
                 ,0x1c);
      Catch::StringRef::StringRef((StringRef *)this_00,(char *)in_stack_fffffffffffffeb8);
      capturedExpression.m_size = sVar3;
      capturedExpression.m_start = (char *)pfVar1;
      Catch::AssertionHandler::AssertionHandler
                (this_00,in_stack_fffffffffffffeb8,(SourceLineInfo *)in_stack_fffffffffffffeb0.m_lhs
                 ,capturedExpression,(Flags)in_stack_fffffffffffffeac);
      in_stack_fffffffffffffeb8 = (StringRef *)AlignedVector<float>::operator[](&local_20,local_38);
      in_stack_fffffffffffffeb0 =
           Catch::Decomposer::operator<=
                     ((Decomposer *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                      (float *)0x28b723);
      in_stack_fffffffffffffea8 = (float)(long)local_38;
      in_stack_fffffffffffffeac = (float)local_38;
      Catch::ExprLhs<float_const&>::operator==(this,pfVar2);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)in_stack_fffffffffffffeb0.m_lhs,
                 (ITransientExpression *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
                ((BinaryExpr<const_float_&,_const_float_&> *)0x28b7b3);
      Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffeb0.m_lhs);
      Catch::AssertionHandler::~AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffffeb0.m_lhs);
    }
    AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x28b8cb);
    AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x28b8d8);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}